

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_near_optimal_merge_stats(libdeflate_compressor *c)

{
  int *piVar1;
  long lVar2;
  
  merge_new_observations(&c->split_stats);
  for (lVar2 = -0x40c; lVar2 != 0; lVar2 = lVar2 + 4) {
    piVar1 = (int *)((long)&c->p + lVar2 + 0x896a24);
    *piVar1 = *piVar1 + *(int *)((long)&c->p + lVar2 + 0x896618);
    *(undefined4 *)((long)&c->p + lVar2 + 0x896618) = 0;
  }
  return;
}

Assistant:

static void
deflate_near_optimal_merge_stats(struct libdeflate_compressor *c)
{
	unsigned i;

	merge_new_observations(&c->split_stats);
	for (i = 0; i < ARRAY_LEN(c->p.n.match_len_freqs); i++) {
		c->p.n.match_len_freqs[i] += c->p.n.new_match_len_freqs[i];
		c->p.n.new_match_len_freqs[i] = 0;
	}
}